

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_Test::
testBody(TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingAComparisonRepository_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *test;
  MockFailureReporterInstaller failureReporterInstaller;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  MyTypeForTesting object;
  MockNoWayToCompareCustomTypeFailure expectedFailure;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&failureReporterInstaller);
  MyTypeForTesting::MyTypeForTesting(&object,1);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"");
  pMVar2 = mock((SimpleString *)&expectedFailure,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_b0);
  SimpleString::SimpleString(&local_90,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a0,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_90,&local_a0,&object);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"");
  pMVar2 = mock((SimpleString *)&expectedFailure,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_b0);
  SimpleString::SimpleString(&local_90,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a0,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x20))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_90,&local_a0,&object);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_b0,"MyTypeForTesting");
  MockNoWayToCompareCustomTypeFailure::MockNoWayToCompareCustomTypeFailure
            (&expectedFailure,test,&local_b0);
  SimpleString::~SimpleString(&local_b0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&expectedFailure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x5b);
  TestFailure::~TestFailure((TestFailure *)&expectedFailure);
  MyTypeForTesting::~MyTypeForTesting(&object);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&failureReporterInstaller);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectParameterFailsWhenNotHavingAComparisonRepository)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(1);
    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);

    MockNoWayToCompareCustomTypeFailure expectedFailure(mockFailureTest(), "MyTypeForTesting");
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}